

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
::
internal_emplace<absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*>*&>
          (btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
           *this,iterator iter,
          map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
          **args)

{
  btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
  *this_00;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  field_type i;
  int *piVar4;
  key_compare *this_01;
  iterator iVar5;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_75;
  int local_74 [2];
  undefined1 local_69;
  undefined1 auStack_68 [7];
  bool replaced_node;
  anon_class_24_3_6b874288 replace_leaf_root_node;
  anon_class_8_1_a7a39255 transfer_and_delete;
  allocator_type *alloc;
  field_type max_count;
  map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
  **args_local;
  btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
  *this_local;
  iterator iter_local;
  
  this_local = (btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                *)iter.node_;
  iter_local.node_._0_4_ = iter.position_;
  bVar1 = btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::is_internal((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                         *)this_local);
  if (bVar1) {
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>
    ::operator--((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>
                  *)&this_local);
    iter_local.node_._0_4_ = (int)iter_local.node_ + 1;
  }
  bVar2 = btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::max_count((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                       *)this_local);
  transfer_and_delete.alloc =
       (allocator_type **)
       btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
       ::mutable_allocator((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                            *)this);
  replace_leaf_root_node.transfer_and_delete = &transfer_and_delete;
  _auStack_68 = (iterator *)&this_local;
  replace_leaf_root_node.this =
       (btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
        *)&replace_leaf_root_node.transfer_and_delete;
  local_69 = 0;
  replace_leaf_root_node.iter = (iterator *)this;
  bVar3 = btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::count((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                   *)this_local);
  if (bVar3 == bVar2) {
    if (bVar2 < 6) {
      local_74[1] = 6;
      local_74[0] = (uint)bVar2 << 1;
      piVar4 = std::min<int>(local_74 + 1,local_74);
      btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
      ::
      internal_emplace<absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*&>
      ::anon_class_24_3_6b874288::operator()
                ((anon_class_24_3_6b874288 *)auStack_68,(field_type)*piVar4);
      local_69 = 1;
    }
    else {
      btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
      ::rebalance_or_split
                ((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                  *)this,(iterator *)&this_local);
    }
  }
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
  ::
  emplace_value<absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*>*&>
            ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
              *)this_local,(field_type)(int)iter_local.node_,
             (allocator_type *)transfer_and_delete.alloc,args);
  this_00 = this_local;
  i = (field_type)(int)iter_local.node_;
  this_01 = btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
            ::key_comp((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                        *)this);
  StringBtreeDefaultLess::operator_cast_to_less(this_01);
  bVar1 = btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
          ::is_ordered_correctly<std::less<std::__cxx11::string>>
                    ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
                      *)this_00,i,&local_75);
  if (bVar1) {
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>
    ::update_generation((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>
                         *)&this_local);
    iVar5.position_ = (int)iter_local.node_;
    iVar5.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                   *)this_local;
    iVar5._12_4_ = 0;
    return iVar5;
  }
  __assert_fail("iter.node_->is_ordered_correctly(static_cast<field_type>(iter.position_), original_key_compare(key_comp())) && \"If this assert fails, then either (1) the comparator may violate \" \"transitivity, i.e. comp(a,b) && comp(b,c) -> comp(a,c) (see \" \"https://en.cppreference.com/w/cpp/named_req/Compare), or (2) a \" \"key may have been mutated after it was inserted into the tree.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                ,0xb42,
                "iterator absl::container_internal::btree<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>, Args = <absl::container_internal::map_slot_type<std::basic_string<char>, const google::protobuf::FileDescriptorProto *> *&>]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&...args)
    -> iterator {
  if (iter.node_->is_internal()) {
    // We can't insert on an internal node. Instead, we'll insert after the
    // previous value which is guaranteed to be on a leaf node.
    --iter;
    ++iter.position_;
  }
  const field_type max_count = iter.node_->max_count();
  allocator_type *alloc = mutable_allocator();

  const auto transfer_and_delete = [&](node_type *old_node,
                                       node_type *new_node) {
    new_node->transfer_n(old_node->count(), new_node->start(),
                         old_node->start(), old_node, alloc);
    new_node->set_finish(old_node->finish());
    old_node->set_finish(old_node->start());
    new_node->set_generation(old_node->generation());
    node_type::clear_and_delete(old_node, alloc);
  };
  const auto replace_leaf_root_node = [&](field_type new_node_size) {
    assert(iter.node_ == root());
    node_type *old_root = iter.node_;
    node_type *new_root = iter.node_ = new_leaf_root_node(new_node_size);
    transfer_and_delete(old_root, new_root);
    mutable_root() = mutable_rightmost() = new_root;
  };

  bool replaced_node = false;
  if (iter.node_->count() == max_count) {
    // Make room in the leaf for the new item.
    if (max_count < kNodeSlots) {
      // Insertion into the root where the root is smaller than the full node
      // size. Simply grow the size of the root node.
      replace_leaf_root_node(static_cast<field_type>(
          (std::min)(static_cast<int>(kNodeSlots), 2 * max_count)));
      replaced_node = true;
    } else {
      rebalance_or_split(&iter);
    }
  }
  (void)replaced_node;
#if defined(ABSL_HAVE_ADDRESS_SANITIZER) || \
    defined(ABSL_HAVE_HWADDRESS_SANITIZER)
  if (!replaced_node) {
    assert(iter.node_->is_leaf());
    if (iter.node_->is_root()) {
      replace_leaf_root_node(max_count);
    } else {
      node_type *old_node = iter.node_;
      const bool was_rightmost = rightmost() == old_node;
      const bool was_leftmost = leftmost() == old_node;
      node_type *parent = old_node->parent();
      const field_type position = old_node->position();
      node_type *new_node = iter.node_ = new_leaf_node(position, parent);
      parent->set_child_noupdate_position(position, new_node);
      transfer_and_delete(old_node, new_node);
      if (was_rightmost) mutable_rightmost() = new_node;
      // The leftmost node is stored as the parent of the root node.
      if (was_leftmost) root()->set_parent(new_node);
    }
  }
#endif
  iter.node_->emplace_value(static_cast<field_type>(iter.position_), alloc,
                            std::forward<Args>(args)...);
  assert(
      iter.node_->is_ordered_correctly(static_cast<field_type>(iter.position_),
                                       original_key_compare(key_comp())) &&
      "If this assert fails, then either (1) the comparator may violate "
      "transitivity, i.e. comp(a,b) && comp(b,c) -> comp(a,c) (see "
      "https://en.cppreference.com/w/cpp/named_req/Compare), or (2) a "
      "key may have been mutated after it was inserted into the tree.");
  ++size_;
  iter.update_generation();
  return iter;
}